

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-seri.c
# Opt level: O2

void push_value(lua_State *L,read_block *rb,int type,int cookie)

{
  int iVar1;
  lua_Number *plVar2;
  undefined8 *puVar3;
  ushort *puVar4;
  byte *pbVar5;
  lua_Integer lVar6;
  uint *puVar7;
  uint cookie_00;
  ulong uVar8;
  long n;
  
  switch(type) {
  case 0:
    lua_pushnil(L);
    return;
  case 1:
    lua_pushboolean(L,cookie);
    return;
  case 2:
    if (cookie != 8) {
      lVar6 = get_integer(L,rb,cookie);
      lua_pushinteger(L,lVar6);
      return;
    }
    plVar2 = (lua_Number *)rb_read(rb,8);
    if (plVar2 == (lua_Number *)0x0) {
      invalid_stream_line(L,rb,0x195);
    }
    lua_pushnumber(L,*plVar2);
    return;
  case 3:
    puVar3 = (undefined8 *)rb_read(rb,8);
    if (puVar3 == (undefined8 *)0x0) {
      invalid_stream_line(L,rb,0x19f);
    }
    lua_pushlightuserdata(L,(void *)*puVar3);
    return;
  case 4:
    break;
  case 5:
    if (cookie != 4) {
      if (cookie == 2) {
        puVar4 = (ushort *)rb_read(rb,2);
        if (puVar4 == (ushort *)0x0) {
          invalid_stream_line(L,rb,0x1eb);
        }
        cookie = (int)*puVar4;
        break;
      }
      invalid_stream_line(L,rb,0x1f2);
    }
    puVar7 = (uint *)rb_read(rb,4);
    if (puVar7 == (uint *)0x0) {
      invalid_stream_line(L,rb,0x1f6);
    }
    cookie = *puVar7;
    break;
  case 6:
    if (cookie == 0x1f) {
      pbVar5 = (byte *)rb_read(rb,1);
      if (pbVar5 == (byte *)0x0) {
        invalid_stream_line(L,rb,0x1b6);
      }
      cookie_00 = (uint)(*pbVar5 >> 3);
      if ((*pbVar5 & 7) != 2 || cookie_00 == 8) {
        invalid_stream_line(L,rb,0x1bb);
      }
      lVar6 = get_integer(L,rb,cookie_00);
      cookie = (int)lVar6;
    }
    uVar8 = 0;
    luaL_checkstack(L,0x14,(char *)0x0);
    lua_createtable(L,cookie,0);
    if (0 < cookie) {
      uVar8 = (ulong)(uint)cookie;
    }
    for (n = 1; n - uVar8 != 1; n = n + 1) {
      unpack_one(L,rb);
      lua_rawseti(L,-2,n);
    }
    while( true ) {
      unpack_one(L,rb);
      iVar1 = lua_type(L,-1);
      if (iVar1 == 0) break;
      unpack_one(L,rb);
      lua_rawset(L,-3);
    }
    lua_settop(L,-2);
    return;
  default:
    invalid_stream_line(L,rb,0x203);
    return;
  }
  get_buffer(L,rb,cookie);
  return;
}

Assistant:

static void
push_value(lua_State *L, struct read_block *rb, int type, int cookie) {
	switch(type) {
	case TYPE_NIL:
		lua_pushnil(L);
		break;
	case TYPE_BOOLEAN:
		lua_pushboolean(L,cookie);
		break;
	case TYPE_NUMBER:
		if (cookie == TYPE_NUMBER_REAL) {
			lua_pushnumber(L,get_real(L,rb));
		} else {
			lua_pushinteger(L, get_integer(L, rb, cookie));
		}
		break;
	case TYPE_USERDATA:
		lua_pushlightuserdata(L,get_pointer(L,rb));
		break;
	case TYPE_SHORT_STRING:
		get_buffer(L,rb,cookie);
		break;
	case TYPE_LONG_STRING: {
		if (cookie == 2) {
			uint16_t *plen = rb_read(rb, 2);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint16_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		} else {
			if (cookie != 4) {
				invalid_stream(L,rb);
			}
			uint32_t *plen = rb_read(rb, 4);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint32_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		}
		break;
	}
	case TYPE_TABLE: {
		unpack_table(L,rb,cookie);
		break;
	}
	default: {
		invalid_stream(L,rb);
		break;
	}
	}
}